

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<char,_true,_5>_> __thiscall
immutable::rrb_details::rrb_drop_left<char,true,5>
          (rrb_details *this,ref<immutable::rrb<char,_true,_5>_> *in,uint32_t left)

{
  int *piVar1;
  atomic<unsigned_int> *paVar2;
  __int_type _Var3;
  uint32_t uVar4;
  rrb<char,_true,_5> *prVar5;
  void *__ptr;
  tree_node<char,_true> *ptVar6;
  leaf_node<char,_true> *plVar7;
  ref<immutable::rrb<char,_true,_5>_> p_node;
  uint32_t i;
  uint uVar8;
  rrb<char,_true,_5> *prVar9;
  leaf_node<char,_true> *plVar10;
  undefined4 *__ptr_00;
  undefined8 *puVar11;
  undefined8 *puVar12;
  ulong uVar13;
  leaf_node<char,_true> *plVar14;
  ulong uVar15;
  char *__function;
  long lVar16;
  uint uVar17;
  atomic<unsigned_int> *paVar18;
  int *piVar19;
  ref<immutable::rrb<char,_true,_5>_> new_rrb;
  ref<immutable::rrb<char,_true,_5>_> local_60;
  ref<immutable::rrb<char,_true,_5>_> local_58;
  atomic<unsigned_int> *local_50;
  leaf_node<char,_true> *local_48;
  rrb<char,_true,_5> *local_40;
  uint32_t local_34;
  
  prVar9 = in->ptr;
  local_40 = (rrb<char,_true,_5> *)this;
  if (prVar9 != (rrb<char,_true,_5> *)0x0) {
    uVar17 = prVar9->cnt;
    uVar8 = uVar17 - left;
    if (uVar17 < left || uVar8 == 0) {
      puVar11 = (undefined8 *)malloc(0x28);
      *puVar11 = 0;
      *(undefined4 *)(puVar11 + 1) = 0;
      puVar12 = (undefined8 *)malloc(0x18);
      puVar11[2] = 0;
      puVar11[3] = 0;
      *puVar12 = 0;
      puVar12[2] = 0;
      *(undefined4 *)((long)puVar12 + 0xc) = 0;
      LOCK();
      *(undefined4 *)(puVar12 + 1) = 1;
      UNLOCK();
      LOCK();
      *(int *)(puVar12 + 1) = *(int *)(puVar12 + 1) + 1;
      UNLOCK();
      puVar11[2] = puVar12;
      LOCK();
      piVar19 = (int *)(puVar12 + 1);
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        free(puVar12);
      }
      *(undefined8 **)local_40 = puVar11;
      LOCK();
      *(undefined4 *)(puVar11 + 4) = 1;
      UNLOCK();
      return (ref<immutable::rrb<char,_true,_5>_>)local_40;
    }
    if (left == 0) {
LAB_00132ea7:
      if ((prVar9->shift != 0) ||
         (ptVar6 = (prVar9->root).ptr, ptVar6 == (tree_node<char,_true> *)0x0)) {
LAB_00132eae:
        prVar9 = in->ptr;
        *(rrb<char,_true,_5> **)local_40 = prVar9;
        if (prVar9 != (rrb<char,_true,_5> *)0x0) {
          LOCK();
          (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i =
               (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        return (ref<immutable::rrb<char,_true,_5>_>)local_40;
      }
      uVar17 = prVar9->cnt;
      uVar15 = (ulong)uVar17;
      if (uVar15 < 0x21) {
        plVar10 = (leaf_node<char,_true> *)malloc(uVar15 + 0x18);
        plVar10->len = uVar17;
        plVar10->type = LEAF_NODE;
        plVar10->child = (char *)(plVar10 + 1);
        plVar10->guid = 0;
        if (uVar17 == 0) {
          LOCK();
          (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
        }
        else {
          uVar13 = 0;
          do {
            plVar10->child[uVar13] = '\0';
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
          prVar9 = in->ptr;
          LOCK();
          (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
          if (prVar9 == (rrb<char,_true,_5> *)0x0) goto LAB_001331fe;
        }
        paVar18 = &plVar10->_ref_count;
        uVar15 = 0;
        do {
          ptVar6 = (prVar9->root).ptr;
          if (ptVar6 == (tree_node<char,_true> *)0x0) goto LAB_0013329d;
          if (ptVar6->len <= uVar15) {
            uVar15 = 0;
            goto LAB_00133056;
          }
          plVar10->child[uVar15] = *(char *)(*(long *)(ptVar6 + 1) + uVar15);
          uVar15 = uVar15 + 1;
          prVar9 = in->ptr;
        } while (prVar9 != (rrb<char,_true,_5> *)0x0);
      }
      else {
        if (0x1f < uVar17 - prVar9->tail_len) goto LAB_00132eae;
        uVar4 = ptVar6->len;
        plVar10 = (leaf_node<char,_true> *)malloc(0x38);
        plVar10->type = LEAF_NODE;
        plVar10->len = 0x20;
        plVar10->child = (char *)(plVar10 + 1);
        plVar10->guid = 0;
        lVar16 = 0;
        do {
          plVar10->child[lVar16] = '\0';
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x20);
        LOCK();
        (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        prVar9 = in->ptr;
        local_48 = plVar10;
        if (prVar9 != (rrb<char,_true,_5> *)0x0) {
          uVar17 = 0x20 - uVar4;
          local_50 = (atomic<unsigned_int> *)CONCAT44(local_50._4_4_,prVar9->tail_len);
          uVar15 = (ulong)(prVar9->tail_len - uVar17);
          local_34 = uVar4;
          plVar14 = (leaf_node<char,_true> *)malloc(uVar15 + 0x18);
          plVar14->len = (int)local_50 - uVar17;
          plVar14->type = LEAF_NODE;
          plVar14->child = (char *)(plVar14 + 1);
          plVar14->guid = 0;
          if ((int)local_50 - uVar17 == 0) {
            LOCK();
            (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
          }
          else {
            uVar13 = 0;
            do {
              plVar14->child[uVar13] = '\0';
              uVar13 = uVar13 + 1;
            } while (uVar15 != uVar13);
            prVar9 = in->ptr;
            LOCK();
            (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
            if (prVar9 == (rrb<char,_true,_5> *)0x0) goto LAB_001331fe;
          }
          local_50 = &plVar14->_ref_count;
          paVar18 = &local_48->_ref_count;
          uVar15 = 0;
          do {
            ptVar6 = (prVar9->root).ptr;
            if (ptVar6 == (tree_node<char,_true> *)0x0) goto LAB_0013329d;
            if (ptVar6->len <= uVar15) {
              if (local_34 == 0x20) goto LAB_001331c6;
              uVar15 = 0;
              goto LAB_00133181;
            }
            plVar10->child[uVar15] = *(char *)(*(long *)(ptVar6 + 1) + uVar15);
            uVar15 = uVar15 + 1;
            prVar9 = in->ptr;
          } while (prVar9 != (rrb<char,_true,_5> *)0x0);
        }
      }
    }
    else if (prVar9->tail_len < uVar8) {
      prVar9 = (rrb<char,_true,_5> *)malloc(0x28);
      prVar9->cnt = 0;
      prVar9->shift = 0;
      prVar9->tail_len = 0;
      plVar10 = (leaf_node<char,_true> *)malloc(0x18);
      (prVar9->tail).ptr = (leaf_node<char,_true> *)0x0;
      (prVar9->root).ptr = (tree_node<char,_true> *)0x0;
      plVar10->type = LEAF_NODE;
      plVar10->len = 0;
      plVar10->child = (char *)0x0;
      plVar10->guid = 0;
      LOCK();
      (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      LOCK();
      (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      (prVar9->tail).ptr = plVar10;
      LOCK();
      paVar18 = &plVar10->_ref_count;
      (paVar18->super___atomic_base<unsigned_int>)._M_i =
           (paVar18->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar18->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(plVar10);
      }
      LOCK();
      (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      prVar5 = in->ptr;
      local_60.ptr = prVar9;
      if (prVar5 != (rrb<char,_true,_5> *)0x0) {
        rrb_drop_left_rec<char,true,5>
                  ((rrb_details *)&local_58,&prVar9->shift,&prVar5->root,left,prVar5->shift,false);
        p_node.ptr = local_58.ptr;
        if (local_58.ptr != (rrb<char,_true,_5> *)0x0) {
          LOCK();
          (local_58.ptr)->tail_len = (local_58.ptr)->tail_len + 1;
          UNLOCK();
        }
        ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_58);
        if (local_60.ptr != (rrb<char,_true,_5> *)0x0) {
          (local_60.ptr)->cnt = uVar8;
          if (p_node.ptr != (rrb<char,_true,_5> *)0x0) {
            LOCK();
            (p_node.ptr)->tail_len = (p_node.ptr)->tail_len + 1;
            UNLOCK();
          }
          local_58.ptr = (rrb<char,_true,_5> *)((local_60.ptr)->root).ptr;
          ((local_60.ptr)->root).ptr = (tree_node<char,_true> *)p_node.ptr;
          ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_58);
          if (local_60.ptr != (rrb<char,_true,_5> *)0x0) {
            if ((local_60.ptr)->shift == 0) {
              prVar9 = in->ptr;
LAB_00132e3c:
              if (prVar9 == (rrb<char,_true,_5> *)0x0) goto LAB_001331fe;
            }
            else {
              if (p_node.ptr == (rrb<char,_true,_5> *)0x0) {
                __function = 
                "T *immutable::ref<immutable::rrb_details::internal_node<char, true>>::operator->() const [T = immutable::rrb_details::internal_node<char, true>]"
                ;
                goto LAB_001332b2;
              }
              plVar10 = ((p_node.ptr)->tail).ptr;
              prVar9 = in->ptr;
              if (plVar10 == (leaf_node<char,_true> *)0x0) goto LAB_00132e3c;
              if (prVar9 == (rrb<char,_true,_5> *)0x0) goto LAB_001331fe;
              *(uint32_t *)(*(long *)plVar10 + (ulong)((p_node.ptr)->shift - 1) * 4) =
                   (local_60.ptr)->cnt - prVar9->tail_len;
            }
            ref<immutable::rrb_details::leaf_node<char,_true>_>::operator=
                      (&(local_60.ptr)->tail,&prVar9->tail);
            if ((in->ptr != (rrb<char,_true,_5> *)0x0) &&
               (local_60.ptr != (rrb<char,_true,_5> *)0x0)) {
              (local_60.ptr)->tail_len = in->ptr->tail_len;
              LOCK();
              ((local_60.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
                   ((local_60.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
              local_58 = (ref<immutable::rrb<char,_true,_5>_>)in->ptr;
              in->ptr = (rrb<char,_true,_5> *)local_60;
              ref<immutable::rrb<char,_true,_5>_>::~ref(&local_58);
              release<char>((internal_node<char,_true> *)p_node.ptr);
              ref<immutable::rrb<char,_true,_5>_>::~ref(&local_60);
              prVar9 = in->ptr;
              if (prVar9 != (rrb<char,_true,_5> *)0x0) goto LAB_00132ea7;
            }
          }
        }
      }
    }
    else {
      uVar13 = (ulong)uVar8;
      __ptr_00 = (undefined4 *)malloc(uVar13 + 0x18);
      local_48 = (leaf_node<char,_true> *)CONCAT44(local_48._4_4_,uVar8);
      __ptr_00[1] = uVar8;
      uVar15 = 0;
      *__ptr_00 = 0;
      *(undefined4 **)(__ptr_00 + 4) = __ptr_00 + 6;
      __ptr_00[3] = 0;
      do {
        *(undefined1 *)(*(long *)(__ptr_00 + 4) + uVar15) = 0;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
      LOCK();
      __ptr_00[2] = 1;
      UNLOCK();
      piVar19 = __ptr_00 + 2;
      uVar15 = 0;
      while (prVar9 = in->ptr, prVar9 != (rrb<char,_true,_5> *)0x0) {
        plVar10 = (prVar9->tail).ptr;
        if (plVar10 == (leaf_node<char,_true> *)0x0) goto LAB_00133286;
        *(char *)(*(long *)(__ptr_00 + 4) + uVar15) =
             plVar10->child[(left - uVar17) + (int)uVar15 + prVar9->tail_len];
        uVar15 = uVar15 + 1;
        if (uVar13 == uVar15) {
          puVar11 = (undefined8 *)malloc(0x28);
          *puVar11 = 0;
          *(undefined4 *)(puVar11 + 1) = 0;
          puVar12 = (undefined8 *)malloc(0x18);
          puVar11[2] = 0;
          puVar11[3] = 0;
          *puVar12 = 0;
          puVar12[2] = 0;
          *(undefined4 *)((long)puVar12 + 0xc) = 0;
          LOCK();
          *(undefined4 *)(puVar12 + 1) = 1;
          UNLOCK();
          LOCK();
          *(int *)(puVar12 + 1) = *(int *)(puVar12 + 1) + 1;
          UNLOCK();
          puVar11[2] = puVar12;
          LOCK();
          piVar1 = (int *)(puVar12 + 1);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            free(puVar12);
          }
          prVar9 = local_40;
          *(undefined8 **)local_40 = puVar11;
          LOCK();
          *(undefined4 *)(puVar11 + 4) = 1;
          UNLOCK();
          *(undefined4 *)puVar11 = local_48._0_4_;
          *(undefined4 *)(puVar11 + 1) = local_48._0_4_;
          LOCK();
          __ptr_00[2] = __ptr_00[2] + 1;
          UNLOCK();
          __ptr = (void *)puVar11[2];
          puVar11[2] = __ptr_00;
          if (__ptr != (void *)0x0) {
            LOCK();
            piVar1 = (int *)((long)__ptr + 8);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              free(__ptr);
            }
          }
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            free(__ptr_00);
            return (ref<immutable::rrb<char,_true,_5>_>)prVar9;
          }
          return (ref<immutable::rrb<char,_true,_5>_>)prVar9;
        }
      }
    }
  }
  goto LAB_001331fe;
  while( true ) {
    plVar7 = (prVar9->tail).ptr;
    if (plVar7 == (leaf_node<char,_true> *)0x0) goto LAB_00133286;
    ptVar6 = (prVar9->root).ptr;
    if (ptVar6 == (tree_node<char,_true> *)0x0) goto LAB_0013329d;
    plVar10->child[ptVar6->len + (int)uVar15] = plVar7->child[uVar15];
    uVar15 = uVar15 + 1;
    if (uVar17 == uVar15) break;
LAB_00133181:
    prVar9 = in->ptr;
    if (prVar9 == (rrb<char,_true,_5> *)0x0) goto LAB_001331fe;
  }
  prVar9 = in->ptr;
  if (prVar9 != (rrb<char,_true,_5> *)0x0) {
LAB_001331c6:
    uVar15 = 0;
    do {
      uVar8 = prVar9->tail_len - uVar17;
      if (uVar8 <= uVar15) {
        prVar9->tail_len = uVar8;
        LOCK();
        (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        plVar7 = (prVar9->tail).ptr;
        (prVar9->tail).ptr = plVar14;
        if (plVar7 != (leaf_node<char,_true> *)0x0) {
          LOCK();
          paVar2 = &plVar7->_ref_count;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(plVar7);
          }
        }
        prVar9 = in->ptr;
        if (prVar9 != (rrb<char,_true,_5> *)0x0) {
          LOCK();
          (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i =
               (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          local_58.ptr = (rrb<char,_true,_5> *)(prVar9->root).ptr;
          (prVar9->root).ptr = (tree_node<char,_true> *)plVar10;
          ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_58);
          LOCK();
          (local_50->super___atomic_base<unsigned_int>)._M_i =
               (local_50->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((local_50->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(plVar14);
          }
          LOCK();
          (paVar18->super___atomic_base<unsigned_int>)._M_i =
               (paVar18->super___atomic_base<unsigned_int>)._M_i - 1;
          _Var3 = (paVar18->super___atomic_base<unsigned_int>)._M_i;
          UNLOCK();
          goto joined_r0x00133273;
        }
        break;
      }
      plVar7 = (prVar9->tail).ptr;
      if (plVar7 == (leaf_node<char,_true> *)0x0) goto LAB_00133286;
      plVar14->child[uVar15] = plVar7->child[uVar17 + (int)uVar15];
      uVar15 = uVar15 + 1;
      prVar9 = in->ptr;
    } while (prVar9 != (rrb<char,_true,_5> *)0x0);
  }
  goto LAB_001331fe;
LAB_00133286:
  __function = 
  "T *immutable::ref<immutable::rrb_details::leaf_node<char, true>>::operator->() const [T = immutable::rrb_details::leaf_node<char, true>]"
  ;
  goto LAB_001332b2;
LAB_0013329d:
  __function = 
  "T *immutable::ref<immutable::rrb_details::tree_node<char, true>>::operator->() const [T = immutable::rrb_details::tree_node<char, true>]"
  ;
  goto LAB_001332b2;
  while( true ) {
    plVar14 = (prVar9->tail).ptr;
    if (plVar14 == (leaf_node<char,_true> *)0x0) goto LAB_00133286;
    ptVar6 = (prVar9->root).ptr;
    if (ptVar6 == (tree_node<char,_true> *)0x0) goto LAB_0013329d;
    plVar10->child[ptVar6->len + (int)uVar15] = plVar14->child[uVar15];
    uVar15 = uVar15 + 1;
    prVar9 = in->ptr;
    if (prVar9 == (rrb<char,_true,_5> *)0x0) break;
LAB_00133056:
    if (prVar9->tail_len <= uVar15) {
      prVar9->tail_len = prVar9->cnt;
      local_60.ptr = (rrb<char,_true,_5> *)0x0;
      local_58.ptr = (rrb<char,_true,_5> *)(prVar9->root).ptr;
      (prVar9->root).ptr = (tree_node<char,_true> *)0x0;
      ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_58);
      ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_60);
      prVar9 = in->ptr;
      if (prVar9 != (rrb<char,_true,_5> *)0x0) {
        LOCK();
        (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (plVar10->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        plVar14 = (prVar9->tail).ptr;
        (prVar9->tail).ptr = plVar10;
        if (plVar14 != (leaf_node<char,_true> *)0x0) {
          LOCK();
          paVar2 = &plVar14->_ref_count;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(plVar14);
          }
        }
        LOCK();
        (paVar18->super___atomic_base<unsigned_int>)._M_i =
             (paVar18->super___atomic_base<unsigned_int>)._M_i - 1;
        _Var3 = (paVar18->super___atomic_base<unsigned_int>)._M_i;
        UNLOCK();
joined_r0x00133273:
        if (_Var3 == 0) {
          free(plVar10);
        }
        goto LAB_00132eae;
      }
      break;
    }
  }
LAB_001331fe:
  __function = 
  "T *immutable::ref<immutable::rrb<char>>::operator->() const [T = immutable::rrb<char>]";
LAB_001332b2:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_left(ref<rrb<T, atomic_ref_counting, N>> in, uint32_t left)
      {
      using namespace rrb_details;
      if (left >= in->cnt)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (left > 0)
        {
        const uint32_t remaining = in->cnt - left;

        // If we slice into the tail, we just need to modify the tail itself
        if (remaining <= in->tail_len)
          {
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(remaining);
          //memcpy(new_tail->child, &in->tail->child[in->tail_len - remaining], remaining * sizeof(T));
          for (uint32_t i = 0; i < remaining; ++i)
            new_tail->child[i] = in->tail->child[in->tail_len - remaining + i]; // don't memcpy, but use copy constructor

          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
          new_rrb->cnt = remaining;
          new_rrb->tail_len = remaining;
          new_rrb->tail = new_tail;
          return new_rrb;
          }
        // Otherwise, we don't really have to take the tail into consideration.
        // Good!

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<internal_node<T, atomic_ref_counting>> root = rrb_drop_left_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, left, in->shift, false);
        new_rrb->cnt = remaining;
        new_rrb->root = root;

        // Ensure last element in size table is correct size, if the root is an
        // internal node.
        if (new_rrb->shift != 0 && root->size_table.ptr != nullptr)
          {
          root->size_table->size[root->len - 1] = new_rrb->cnt - in->tail_len;
          }
        new_rrb->tail = in->tail;
        new_rrb->tail_len = in->tail_len;
        in = new_rrb;
        }

      // TODO: I think the code below also applies to root nodes where size_table
      // == NULL and (cnt - tail_len) & 0xff != 0, but it may be that this is
      // resolved by rrb_drop_right itself. Perhaps not promote in the right slicing,
      // but here instead?

      // This case handles leaf nodes < RRB_BRANCHING size, by redistributing
      // values from the tail into the actual leaf node.
      if (in->shift == 0 && in->root.ptr != nullptr)
        {
        // two cases to handle: cnt <= RRB_BRANCHING
        //     and (cnt - tail_len) < RRB_BRANCHING

        if (in->cnt <= bits<N>::rrb_branching)
          {
          // can put all into a new tail
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(in->cnt);
          //memcpy(&new_tail->child[0], &((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[0], in->root->len * sizeof(T));
          for (uint32_t i = 0; i < in->root->len; ++i)
            new_tail->child[i] = ((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_tail->child[in->root->len], &in->tail->child[0], in->tail_len * sizeof(T));
          for (uint32_t i = 0; i < in->tail_len; ++i)
            new_tail->child[in->root->len + i] = in->tail->child[i]; // don't memcpy, but use copy constructor
          in->tail_len = in->cnt;
          in->root = ref<tree_node<T, atomic_ref_counting>>(nullptr);
          in->tail = new_tail;
          }
        // no need for <= here, because if the root node is == rrb_branching, the
        // invariant is kept.
        else if (in->cnt - in->tail_len < bits<N>::rrb_branching)
          {
          // create both a new tail and a new root node
          const uint32_t tail_cut = bits<N>::rrb_branching - in->root->len;
          ref<leaf_node<T, atomic_ref_counting>> new_root = leaf_node_create<T, atomic_ref_counting>(bits<N>::rrb_branching);
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(in->tail_len - tail_cut);

          //memcpy(&new_root->child[0], &((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[0], in->root->len * sizeof(T));
          for (uint32_t i = 0; i < in->root->len; ++i)
            new_root->child[i] = ((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_root->child[in->root->len], &in->tail->child[0], tail_cut * sizeof(T));
          for (uint32_t i = 0; i < tail_cut; ++i)
            new_root->child[in->root->len + i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_tail->child[0], &in->tail->child[tail_cut], (in->tail_len - tail_cut) * sizeof(T));
          for (uint32_t i = 0; i < (in->tail_len - tail_cut); ++i)
            new_tail->child[i] = in->tail->child[tail_cut + i]; // don't memcpy, but use copy constructor

          in->tail_len = in->tail_len - tail_cut;
          in->tail = new_tail;
          in->root = new_root;
          }
        }
      return in;
      }